

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O0

FTexture * TGATexture_TryCreate(FileReader *file,int lumpnum)

{
  long lVar1;
  undefined1 local_2e [8];
  TGAHeader hdr;
  int lumpnum_local;
  FileReader *file_local;
  
  hdr._10_4_ = lumpnum;
  unique0x1000015e = file;
  lVar1 = FileReader::GetLength(file);
  if (lVar1 < 0x12) {
    file_local = (FileReader *)0x0;
  }
  else {
    (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[4])
              (stack0xffffffffffffffe8,0,0);
    (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[2])
              (stack0xffffffffffffffe8,local_2e,0x12);
    if ((local_2e[1] == '\0') || (local_2e[1] == '\x01')) {
      if (((short)hdr._4_2_ < 1) ||
         ((((short)hdr._6_2_ < 1 || (0x800 < (short)hdr._4_2_)) || (0x800 < (short)hdr._6_2_)))) {
        file_local = (FileReader *)0x0;
      }
      else if (((((char)hdr.x_origin == '\b') || ((char)hdr.x_origin == '\x0f')) ||
               ((char)hdr.x_origin == '\x10')) ||
              (((char)hdr.x_origin == '\x18' || ((char)hdr.x_origin == ' ')))) {
        if ((local_2e[2] == 0) || (0xb < local_2e[2])) {
          file_local = (FileReader *)0x0;
        }
        else if ((local_2e[2] < 4) || (8 < local_2e[2])) {
          if ((hdr.x_origin._1_1_ & 0x10) == 0) {
            (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (stack0xffffffffffffffe8,0);
            (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (stack0xffffffffffffffe8,(TGAHeader *)local_2e,0x12);
            file_local = (FileReader *)operator_new(0xa8);
            FTGATexture::FTGATexture((FTGATexture *)file_local,hdr._10_4_,(TGAHeader *)local_2e);
          }
          else {
            file_local = (FileReader *)0x0;
          }
        }
        else {
          file_local = (FileReader *)0x0;
        }
      }
      else {
        file_local = (FileReader *)0x0;
      }
    }
    else {
      file_local = (FileReader *)0x0;
    }
  }
  return (FTexture *)file_local;
}

Assistant:

FTexture *TGATexture_TryCreate(FileReader & file, int lumpnum)
{
	TGAHeader hdr;

	if (file.GetLength() < (long)sizeof(hdr)) return NULL;
	
	file.Seek(0, SEEK_SET);
	file.Read(&hdr, sizeof(hdr));
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	
	// Not much that can be done here because TGA does not have a proper
	// header to be identified with.
	if (hdr.has_cm != 0 && hdr.has_cm != 1) return NULL;
	if (hdr.width <=0 || hdr.height <=0 || hdr.width > 2048 || hdr.height > 2048) return NULL;
	if (hdr.bpp != 8 && hdr.bpp != 15 && hdr.bpp != 16 && hdr.bpp !=24 && hdr.bpp !=32) return NULL;
	if (hdr.img_type <= 0 || hdr.img_type > 11) return NULL;
	if (hdr.img_type >=4  && hdr.img_type <= 8) return NULL;
	if ((hdr.img_desc & 16) != 0) return NULL;

	file.Seek(0, SEEK_SET);
	file.Read(&hdr, sizeof(hdr));
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);

	return new FTGATexture(lumpnum, &hdr);
}